

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_thread.hpp
# Opt level: O3

void __thiscall
webfront::http::std::experimental::net::v1::detail::posix_thread::
posix_thread<std::experimental::net::v1::detail::resolver_service_base::work_io_context_runner>
          (posix_thread *this,work_io_context_runner f,uint param_2)

{
  uint uVar1;
  long *__arg;
  error_category *peVar2;
  error_code __ec;
  system_error local_40 [32];
  
  this->joined_ = false;
  __arg = (long *)operator_new(0x10);
  *__arg = (long)&PTR__func_base_00198a88;
  __arg[1] = (long)f.io_context_;
  uVar1 = pthread_create(&this->thread_,(pthread_attr_t *)0x0,
                         networking_ts_detail_posix_thread_function,__arg);
  if (uVar1 != 0) {
    (**(code **)(*__arg + 8))(__arg);
    peVar2 = (error_category *)::std::_V2::system_category();
    __ec._4_4_ = 0;
    __ec._M_value = uVar1;
    __ec._M_cat = peVar2;
    system_error::system_error(local_40,__ec,"thread");
    throw_exception<std::system_error>(local_40);
    ::std::system_error::~system_error(local_40);
  }
  return;
}

Assistant:

posix_thread(Function f, unsigned int = 0)
    : joined_(false)
  {
    start_thread(new func<Function>(f));
  }